

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display-curses.c
# Opt level: O1

void ApplyColorScheme(void)

{
  if (5 < ColorSchemeIdx) {
    ColorSchemeIdx = 0;
  }
  dd_SetColorScheme2Idx(ColorSchemeIdx);
  init_pair(1,(int)ApplyColorScheme::ColorSchemes[ColorSchemeIdx].m_fg,
            (int)ApplyColorScheme::ColorSchemes[ColorSchemeIdx].m_bg);
  init_pair(2,1,7);
  init_pair(3,0,7);
  init_pair(4,0,6);
  init_pair(5,7,0);
  init_pair(6,7,4);
  return;
}

Assistant:

static void ApplyColorScheme(void)
{
  enum
  {
    NUM_SCHEMES = 6
  };

  static struct
  {
    short m_fg;
    short m_bg;
  } ColorSchemes[NUM_SCHEMES] = {
    { COLOR_WHITE, COLOR_BLUE },   { COLOR_BLACK, COLOR_GREEN },
    { COLOR_WHITE, COLOR_BLACK },  { COLOR_WHITE, COLOR_MAGENTA },
    { COLOR_BLACK, COLOR_YELLOW }, { COLOR_RED, COLOR_BLACK }
  };

  if (ColorSchemeIdx >= NUM_SCHEMES) {
    ColorSchemeIdx = 0;
  }

  dd_SetColorScheme2Idx(ColorSchemeIdx);

  init_pair(CP_CARD_REVERSE,
            ColorSchemes[ColorSchemeIdx].m_fg,
            ColorSchemes[ColorSchemeIdx].m_bg);
  init_pair(CP_CARD_RED, COLOR_RED, COLOR_WHITE);
  init_pair(CP_CARD_BLACK, COLOR_BLACK, COLOR_WHITE);
  init_pair(CP_TABLE, COLOR_BLACK, COLOR_CYAN);
  init_pair(CP_LABEL, COLOR_WHITE, COLOR_BLACK);
  init_pair(CP_STATS, COLOR_WHITE, COLOR_BLUE);
}